

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O3

AssertionResult __thiscall
testing::internal::PredicateFormatterFromMatcher<testing::Matcher<unsigned_long>>::operator()
          (void *this,char *value_text,unsigned_long *x)

{
  linked_ptr_internal lVar1;
  bool bVar2;
  size_t sVar3;
  AssertionResult *other;
  unsigned_long *in_RCX;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  extraout_RDX;
  AssertionResult AVar4;
  Matcher<const_unsigned_long_&> matcher;
  StringMatchResultListener listener;
  stringstream ss;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_398;
  AssertionResult local_378;
  Matcher<const_unsigned_long_&> local_368;
  undefined1 local_350 [16];
  linked_ptr_internal local_340 [2];
  ostream local_330 [112];
  ios_base local_2c0 [264];
  stringstream local_1b8 [16];
  long local_1a8 [14];
  ios_base local_138 [264];
  
  local_350._0_8_ = &PTR__MatcherBase_0016e788;
  local_350._8_8_ = *(undefined8 *)(value_text + 8);
  lVar1.next_ = local_340;
  if ((ostream *)local_350._8_8_ != (ostream *)0x0) {
    linked_ptr_internal::join(local_340,(linked_ptr_internal *)(value_text + 0x10));
    lVar1.next_ = local_340[0].next_;
  }
  local_340[0].next_ = lVar1.next_;
  local_350._0_8_ = &PTR__MatcherBase_0016e740;
  MatcherCastImpl<const_unsigned_long_&,_testing::Matcher<unsigned_long>_>::Cast
            (&local_368,(Matcher<unsigned_long> *)local_350);
  local_350._0_8_ = &PTR__MatcherBase_0016e788;
  linked_ptr<const_testing::MatcherInterface<unsigned_long>_>::~linked_ptr
            ((linked_ptr<const_testing::MatcherInterface<unsigned_long>_> *)(local_350 + 8));
  local_350._8_8_ = local_330;
  local_350._0_8_ = &PTR__StringMatchResultListener_0016e8f0;
  std::__cxx11::stringstream::stringstream((stringstream *)local_340);
  bVar2 = MatchPrintAndExplain<unsigned_long_const,unsigned_long_const&>
                    (in_RCX,&local_368,(MatchResultListener *)local_350);
  if (bVar2) {
    AssertionSuccess();
  }
  else {
    std::__cxx11::stringstream::stringstream(local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Value of: ",10);
    if (x == (unsigned_long *)0x0) {
      std::ios::clear((int)(ostream *)local_1a8 + (int)*(undefined8 *)(local_1a8[0] + -0x18));
    }
    else {
      sVar3 = strlen((char *)x);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,(char *)x,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Expected: ",10);
    (*((local_368.super_MatcherBase<const_unsigned_long_&>.impl_.value_)->
      super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface[2])
              (local_368.super_MatcherBase<const_unsigned_long_&>.impl_.value_,(ostream *)local_1a8)
    ;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n  Actual: ",0xb);
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,local_398._M_dataplus._M_p,local_398._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_398._M_dataplus._M_p != &local_398.field_2) {
      operator_delete(local_398._M_dataplus._M_p,local_398.field_2._M_allocated_capacity + 1);
    }
    AssertionFailure();
    std::__cxx11::stringbuf::str();
    other = AssertionResult::operator<<(&local_378,&local_398);
    AssertionResult::AssertionResult((AssertionResult *)this,other);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_398._M_dataplus._M_p != &local_398.field_2) {
      operator_delete(local_398._M_dataplus._M_p,local_398.field_2._M_allocated_capacity + 1);
    }
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_378.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    std::__cxx11::stringstream::~stringstream(local_1b8);
    std::ios_base::~ios_base(local_138);
  }
  local_350._0_8_ = &PTR__StringMatchResultListener_0016e8f0;
  std::__cxx11::stringstream::~stringstream((stringstream *)local_340);
  std::ios_base::~ios_base(local_2c0);
  local_368.super_MatcherBase<const_unsigned_long_&>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_0016e8d0;
  linked_ptr<const_testing::MatcherInterface<const_unsigned_long_&>_>::~linked_ptr
            (&local_368.super_MatcherBase<const_unsigned_long_&>.impl_);
  AVar4.message_.ptr_ = extraout_RDX.ptr_;
  AVar4._0_8_ = this;
  return AVar4;
}

Assistant:

AssertionResult operator()(const char* value_text, const T& x) const {
    // We convert matcher_ to a Matcher<const T&> *now* instead of
    // when the PredicateFormatterFromMatcher object was constructed,
    // as matcher_ may be polymorphic (e.g. NotNull()) and we won't
    // know which type to instantiate it to until we actually see the
    // type of x here.
    //
    // We write SafeMatcherCast<const T&>(matcher_) instead of
    // Matcher<const T&>(matcher_), as the latter won't compile when
    // matcher_ has type Matcher<T> (e.g. An<int>()).
    // We don't write MatcherCast<const T&> either, as that allows
    // potentially unsafe downcasting of the matcher argument.
    const Matcher<const T&> matcher = SafeMatcherCast<const T&>(matcher_);
    StringMatchResultListener listener;
    if (MatchPrintAndExplain(x, matcher, &listener))
      return AssertionSuccess();

    ::std::stringstream ss;
    ss << "Value of: " << value_text << "\n"
       << "Expected: ";
    matcher.DescribeTo(&ss);
    ss << "\n  Actual: " << listener.str();
    return AssertionFailure() << ss.str();
  }